

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_send.c
# Opt level: O0

void ares_send(ares_channel_t *channel,uchar *qbuf,int qlen,ares_callback callback,void *arg)

{
  ares_status_t aVar1;
  void *arg_00;
  void *carg;
  ares_dns_record_t *paStack_38;
  ares_status_t status;
  ares_dns_record_t *dnsrec;
  void *arg_local;
  ares_callback callback_local;
  uchar *puStack_18;
  int qlen_local;
  uchar *qbuf_local;
  ares_channel_t *channel_local;
  
  paStack_38 = (ares_dns_record_t *)0x0;
  if (channel != (ares_channel_t *)0x0) {
    dnsrec = (ares_dns_record_t *)arg;
    arg_local = callback;
    callback_local._4_4_ = qlen;
    puStack_18 = qbuf;
    qbuf_local = (uchar *)channel;
    if ((qlen < 0xc) || (0xffff < qlen)) {
      (*callback)(arg,7,0,(uchar *)0x0,0);
    }
    else {
      aVar1 = ares_dns_parse(qbuf,(long)qlen,0,&stack0xffffffffffffffc8);
      if (aVar1 == ARES_SUCCESS) {
        arg_00 = ares_dnsrec_convert_arg((ares_callback)arg_local,dnsrec);
        if (arg_00 == (void *)0x0) {
          ares_dns_record_destroy(paStack_38);
          (*(code *)arg_local)(dnsrec,0xf,0,0);
        }
        else {
          ares_send_dnsrec((ares_channel_t *)qbuf_local,paStack_38,ares_dnsrec_convert_cb,arg_00,
                           (unsigned_short *)0x0);
          ares_dns_record_destroy(paStack_38);
        }
      }
      else {
        (*(code *)arg_local)(dnsrec,aVar1,0,0);
      }
    }
  }
  return;
}

Assistant:

void ares_send(ares_channel_t *channel, const unsigned char *qbuf, int qlen,
               ares_callback callback, void *arg)
{
  ares_dns_record_t *dnsrec = NULL;
  ares_status_t      status;
  void              *carg = NULL;

  if (channel == NULL) {
    return;
  }

  /* Verify that the query is at least long enough to hold the header. */
  if (qlen < HFIXEDSZ || qlen >= (1 << 16)) {
    callback(arg, ARES_EBADQUERY, 0, NULL, 0);
    return;
  }

  status = ares_dns_parse(qbuf, (size_t)qlen, 0, &dnsrec);
  if (status != ARES_SUCCESS) {
    callback(arg, (int)status, 0, NULL, 0);
    return;
  }

  carg = ares_dnsrec_convert_arg(callback, arg);
  if (carg == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    status = ARES_ENOMEM;
    ares_dns_record_destroy(dnsrec);
    callback(arg, (int)status, 0, NULL, 0);
    return;
    /* LCOV_EXCL_STOP */
  }

  ares_send_dnsrec(channel, dnsrec, ares_dnsrec_convert_cb, carg, NULL);

  ares_dns_record_destroy(dnsrec);
}